

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O3

bool __thiscall Regex::processSubTree(Regex *this,Element *cur_node,ParseData *data)

{
  bool bVar1;
  Element *pEVar2;
  Element *top_node;
  Element *cur_node_00;
  
  if (cur_node == (Element *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = processElement(this,cur_node,data);
    pEVar2 = cur_node;
    if (bVar1) {
      do {
        if (((pEVar2->mType == TYPE_OR) || (pEVar2->mType == TYPE_CLASS)) ||
           (cur_node_00 = pEVar2->mChild, cur_node_00 == (Element *)0x0)) {
          while (cur_node_00 = pEVar2->mNext, cur_node_00 == (Element *)0x0) {
            pEVar2 = pEVar2->mParent;
            if (pEVar2 == cur_node) {
              return bVar1;
            }
          }
        }
        bVar1 = processElement(this,cur_node_00,data);
        pEVar2 = cur_node_00;
      } while (bVar1);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool	Regex::processSubTree( Element *cur_node, ParseData *data )
{
	Element *top_node = cur_node;
	
	while( cur_node != NULL )
	{
		if ( processElement( cur_node, data ) == false )
			return false;
		
		if ( cur_node->mType != TYPE_CLASS && cur_node->mType != TYPE_OR && cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( top_node == cur_node->mParent )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return true;
}